

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kdtree.hpp
# Opt level: O0

void __thiscall
diy::detail::KDTreePartners::link_neighbors
          (KDTreePartners *this,int param_2,int gid,vector<int,_std::allocator<int>_> *partners,
          Master *m)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  set<int,_std::less<int>,_std::allocator<int>_> *in_RCX;
  char *__to;
  Master *in_R8;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar4;
  const_iterator it;
  int i;
  set<int,_std::less<int>,_std::allocator<int>_> result;
  Link *link;
  int lid;
  set<int,_std::less<int>,_std::allocator<int>_> *in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  _Rb_tree_const_iterator<int> in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  int iVar5;
  _Self in_stack_ffffffffffffff68;
  _Self in_stack_ffffffffffffff70;
  int local_64;
  
  uVar2 = Master::lid((Master *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                      (int)((ulong)in_stack_ffffffffffffff58._M_node >> 0x20));
  Master::link(in_R8,(char *)(ulong)uVar2,__to);
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x1ab09e);
  local_64 = 0;
  while( true ) {
    iVar5 = local_64;
    iVar3 = Link::size((Link *)0x1ab0bb);
    if (iVar3 <= iVar5) break;
    Link::target((Link *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                 (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
    pVar4 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                      ((set<int,_std::less<int>,_std::allocator<int>_> *)
                       in_stack_ffffffffffffff70._M_node,
                       (value_type_conflict *)in_stack_ffffffffffffff68._M_node);
    in_stack_ffffffffffffff58 = pVar4.first._M_node;
    in_stack_ffffffffffffff57 = pVar4.second;
    local_64 = local_64 + 1;
  }
  std::set<int,_std::less<int>,_std::allocator<int>_>::begin(in_stack_ffffffffffffff48);
  while( true ) {
    std::set<int,_std::less<int>,_std::allocator<int>_>::end(in_stack_ffffffffffffff48);
    bVar1 = std::operator!=((_Self *)&stack0xffffffffffffff70,(_Self *)&stack0xffffffffffffff68);
    if (!bVar1) break;
    in_stack_ffffffffffffff48 = in_RCX;
    std::_Rb_tree_const_iterator<int>::operator*((_Rb_tree_const_iterator<int> *)0x1ab170);
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)CONCAT44(iVar5,in_stack_ffffffffffffff60),
               (value_type_conflict *)in_stack_ffffffffffffff58._M_node);
    std::_Rb_tree_const_iterator<int>::operator++
              ((_Rb_tree_const_iterator<int> *)
               CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
  }
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x1ab196);
  return;
}

Assistant:

inline void   link_neighbors(int, int gid, std::vector<int>& partners, const diy::Master& m) const
  {
    int         lid  = m.lid(gid);
    diy::Link*  link = m.link(lid);

    std::set<int> result;       // partners must be unique
    for (int i = 0; i < link->size(); ++i)
        result.insert(link->target(i).gid);

    for (std::set<int>::const_iterator it = result.begin(); it != result.end(); ++it)
        partners.push_back(*it);
  }